

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::variable_storage_is_aliased(Compiler *this,SPIRVariable *v)

{
  bool bVar1;
  bool bVar2;
  SPIRType *pSVar3;
  mapped_type *pmVar4;
  bool bVar5;
  BaseType BVar6;
  bool bVar7;
  StorageClass SVar8;
  Bitset local_68;
  
  pSVar3 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(v->super_IVariant).field_0xc);
  if (v->storage == StorageBuffer) {
    BVar6 = pSVar3->basetype;
    SVar8 = pSVar3->storage;
  }
  else {
    pmVar4 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->ir).meta,&(pSVar3->super_IVariant).self);
    BVar6 = pSVar3->basetype;
    SVar8 = pSVar3->storage;
    if (((pmVar4->decoration).decoration_flags.lower & 8) == 0) {
      bVar5 = ParsedIR::has_decoration(&this->ir,(ID)(v->super_IVariant).self.id,DecorationRestrict)
      ;
      bVar1 = false;
      goto LAB_003284cb;
    }
  }
  ParsedIR::get_buffer_block_flags(&local_68,&this->ir,v);
  bVar5 = (bool)((byte)((uint)local_68.lower >> 0x13) & 1);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68.higher._M_h);
  bVar1 = true;
LAB_003284cb:
  bVar7 = (bool)(bVar5 ^ 1);
  bVar2 = BVar6 == AtomicCounter || SVar8 == PhysicalStorageBuffer;
  if (BVar6 == Image) {
    bVar2 = bVar7;
  }
  if (bVar5 != false) {
    bVar2 = bVar7;
  }
  if (bVar1) {
    bVar2 = bVar7;
  }
  return bVar2;
}

Assistant:

bool Compiler::variable_storage_is_aliased(const SPIRVariable &v)
{
	auto &type = get<SPIRType>(v.basetype);
	bool ssbo = v.storage == StorageClassStorageBuffer ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	bool image = type.basetype == SPIRType::Image;
	bool counter = type.basetype == SPIRType::AtomicCounter;
	bool buffer_reference = type.storage == StorageClassPhysicalStorageBufferEXT;

	bool is_restrict;
	if (ssbo)
		is_restrict = ir.get_buffer_block_flags(v).get(DecorationRestrict);
	else
		is_restrict = has_decoration(v.self, DecorationRestrict);

	return !is_restrict && (ssbo || image || counter || buffer_reference);
}